

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::predict_or_learn_bag<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  polyprediction *this;
  pointer ppeVar1;
  pointer ppeVar2;
  pointer pfVar3;
  action_score *paVar4;
  v_array<ACTION_SCORE::action_score> *pvVar5;
  bool bVar6;
  size_t i_3;
  action_score *paVar7;
  size_t sVar8;
  ulong uVar9;
  size_t i_1;
  size_t sVar10;
  uint32_t i_2;
  uint uVar11;
  cb_explore_adf *pcVar12;
  uint32_t j;
  uint uVar13;
  uint32_t i;
  uint32_t id;
  action_score local_a8;
  cb_explore_adf *local_a0;
  v_array<ACTION_SCORE::action_score> *__range3;
  example *local_90;
  vector<float,_std::allocator<float>_> *local_88;
  ulong local_80;
  example *local_78;
  score_iterator local_70;
  score_iterator local_60;
  score_iterator local_50;
  score_iterator local_40;
  
  ppeVar1 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_78 = *ppeVar1;
  this = &local_78->pred;
  local_a0 = (cb_explore_adf *)base;
  bVar6 = CB::ec_is_example_header(local_78);
  uVar11 = (int)((ulong)((long)ppeVar2 - (long)ppeVar1) >> 3) - (uint)bVar6;
  if (uVar11 == 0) {
    v_array<ACTION_SCORE::action_score>::clear
              ((v_array<ACTION_SCORE::action_score> *)&this->scalars);
    return;
  }
  pfVar3 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar3) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar3;
  }
  uVar13 = uVar11;
  __range3 = (v_array<ACTION_SCORE::action_score> *)this;
  while (bVar6 = uVar13 != 0, uVar13 = uVar13 - 1, bVar6) {
    local_a8.action = 0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&data->scores,(float *)&local_a8);
  }
  local_88 = &data->top_actions;
  local_80 = (ulong)uVar11;
  local_a8.action = 0;
  std::vector<float,_std::allocator<float>_>::_M_fill_assign
            (local_88,local_80,(value_type_conflict3 *)&local_a8);
  local_90 = test_adf_sequence(examples);
  uVar9 = 0;
  while (id = (uint32_t)uVar9, uVar9 < data->bag_size) {
    if ((id != 0) || (uVar11 = 1, data->greedify == false)) {
      uVar11 = BS::weight_gen(data->all);
    }
    pvVar5 = __range3;
    pcVar12 = local_a0;
    if (uVar11 == 0 || local_90 == (example *)0x0) {
      LEARNER::multiline_learn_or_predict<false>((multi_learner *)local_a0,examples,data->offset,id)
      ;
    }
    else {
      LEARNER::multiline_learn_or_predict<true>((multi_learner *)local_a0,examples,data->offset,id);
    }
    paVar4 = (action_score *)(local_78->pred).scalars._end;
    for (paVar7 = (local_78->pred).a_s._begin; paVar7 != paVar4; paVar7 = paVar7 + 1) {
      pfVar3 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3[paVar7->action] = paVar7->score + pfVar3[paVar7->action];
    }
    if (data->first_only == false) {
      sVar8 = fill_tied(pcVar12,pvVar5);
      for (sVar10 = 0; sVar8 != sVar10; sVar10 = sVar10 + 1) {
        uVar13 = pvVar5->_begin[sVar10].action;
        pfVar3 = (local_88->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar3[uVar13] = pfVar3[uVar13] + 1.0 / (float)sVar8;
      }
    }
    else {
      uVar13 = pvVar5->_begin->action;
      pfVar3 = (local_88->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3[uVar13] = pfVar3[uVar13] + 1.0;
    }
    if (local_90 != (example *)0x0) {
      for (uVar13 = 1; uVar13 < uVar11; uVar13 = uVar13 + 1) {
        LEARNER::multiline_learn_or_predict<true>
                  ((multi_learner *)local_a0,examples,data->offset,id);
      }
    }
    uVar9 = (ulong)(id + 1);
  }
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  pvVar5 = __range3;
  for (uVar9 = 0;
      uVar9 < (ulong)((long)(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start >> 2);
      uVar9 = (ulong)((uint32_t)uVar9 + 1)) {
    local_a8.score = 0.0;
    local_a8.action = (uint32_t)uVar9;
    v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,&local_a8);
  }
  local_40._p = (data->action_probs)._begin;
  local_40._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_50._p = (data->action_probs)._end;
  local_50._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::
  generate_bag<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ACTION_SCORE::score_iterator>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             (data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             (data->top_actions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_40,&local_50);
  local_60._p = (data->action_probs)._begin;
  local_60._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_70._p = (data->action_probs)._end;
  local_70._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>
            (data->epsilon,true,&local_60,&local_70);
  do_sort(data);
  for (uVar9 = 0; local_80 != uVar9; uVar9 = uVar9 + 1) {
    pvVar5->_begin[uVar9] = (data->action_probs)._begin[uVar9];
  }
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  v_array<action_score>& preds = examples[0]->pred.a_s;
  uint32_t num_actions = (uint32_t)examples.size();
  if (CB::ec_is_example_header(*examples[0]))
    num_actions--;
  if (num_actions == 0)
  {
    preds.clear();
    return;
  }

  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(0.f);
  vector<float>& top_actions = data.top_actions;
  top_actions.assign(num_actions, 0);
  bool test_sequence = test_adf_sequence(examples) == nullptr;
  for (uint32_t i = 0; i < data.bag_size; i++)
  {
    // avoid updates to the random num generator
    // for greedify, always update first policy once
    uint32_t count = is_learn ? ((data.greedify && i == 0) ? 1 : BS::weight_gen(*data.all)) : 0;

    if (is_learn && count > 0 && !test_sequence)
      multiline_learn_or_predict<true>(base, examples, data.offset, i);
    else
      multiline_learn_or_predict<false>(base, examples, data.offset, i);

    assert(preds.size() == num_actions);
    for (auto e : preds) data.scores[e.action] += e.score;

    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      for (size_t i = 0; i < tied_actions; ++i) top_actions[preds[i].action] += 1.f / tied_actions;
    }
    else
      top_actions[preds[0].action] += 1.f;
    if (is_learn && !test_sequence)
      for (uint32_t j = 1; j < count; j++) multiline_learn_or_predict<true>(base, examples, data.offset, i);
  }

  data.action_probs.clear();
  for (uint32_t i = 0; i < data.scores.size(); i++) data.action_probs.push_back({i, 0.});

  // generate distribution over actions
  generate_bag(
      begin(data.top_actions), end(data.top_actions), begin_scores(data.action_probs), end_scores(data.action_probs));

  enforce_minimum_probability(data.epsilon, true, begin_scores(data.action_probs), end_scores(data.action_probs));

  do_sort(data);

  for (size_t i = 0; i < num_actions; i++) preds[i] = data.action_probs[i];
}